

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

AtomTypeSet * __thiscall
OpenMD::SimInfo::getSimulatedAtomTypes(AtomTypeSet *__return_storage_ptr__,SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  Atom *pAVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  AtomType *local_40;
  MoleculeIterator local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_38._M_node == &(this->molecules_)._M_t._M_impl.super__Rb_tree_header)
  {
    pMVar3 = (Molecule *)0x0;
  }
  else {
    pMVar3 = (Molecule *)local_38._M_node[1]._M_parent;
  }
  while (pMVar3 != (Molecule *)0x0) {
    ppAVar4 = (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar4 !=
        (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_001615d6;
    pAVar2 = (Atom *)0x0;
    while (pAVar2 != (Atom *)0x0) {
      local_40 = pAVar2->atomType_;
      std::
      _Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
      ::_M_insert_unique<OpenMD::AtomType*>
                ((_Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
                  *)__return_storage_ptr__,&local_40);
      ppAVar4 = ppAVar4 + 1;
      pAVar2 = (Atom *)0x0;
      if (ppAVar4 !=
          (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_001615d6:
        pAVar2 = *ppAVar4;
      }
    }
    pMVar3 = nextMolecule(this,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

AtomTypeSet SimInfo::getSimulatedAtomTypes() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    AtomTypeSet atomTypes;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atomTypes.insert(atom->getAtomType());
      }
    }

#ifdef IS_MPI

    // loop over the found atom types on this processor, and add their
    // numerical idents to a vector:

    vector<int> foundTypes;
    AtomTypeSet::iterator i;
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i)
      foundTypes.push_back((*i)->getIdent());

    // count_local holds the number of found types on this processor
    int count_local = foundTypes.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    vector<int> counts(nproc, 0);
    vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    // we need a (possibly redundant) set of all found types:
    vector<int> ftGlobal(totalCount);

    // now spray out the foundTypes to all the other processors:
    MPI_Allgatherv(&foundTypes[0], count_local, MPI_INT, &ftGlobal[0],
                   &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

    vector<int>::iterator j;

    // foundIdents is a stl set, so inserting an already found ident
    // will have no effect.
    set<int> foundIdents;

    for (j = ftGlobal.begin(); j != ftGlobal.end(); ++j)
      foundIdents.insert((*j));

    // now iterate over the foundIdents and get the actual atom types
    // that correspond to these:
    set<int>::iterator it;
    for (it = foundIdents.begin(); it != foundIdents.end(); ++it)
      atomTypes.insert(forceField_->getAtomType((*it)));

#endif

    return atomTypes;
  }